

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int update_1rtt_egress_key(quicly_conn_t *conn)

{
  long lVar1;
  long in_RDI;
  int ret;
  ptls_cipher_suite_t *cipher;
  st_quicly_application_space_t *space;
  uint8_t *in_stack_00000070;
  ptls_aead_context_t **in_stack_00000078;
  int in_stack_00000084;
  ptls_cipher_suite_t *in_stack_00000088;
  quicly_conn_t *in_stack_00000090;
  undefined4 local_4;
  
  lVar1 = *(long *)(in_RDI + 0x540);
  ptls_get_cipher(*(ptls_t **)(in_RDI + 0x8b0));
  local_4 = update_1rtt_key(in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000078,
                            in_stack_00000070);
  if (local_4 == 0) {
    *(long *)(lVar1 + 0x108) = *(long *)(lVar1 + 0x108) + 1;
    *(undefined8 *)(lVar1 + 0x110) = *(undefined8 *)(in_RDI + 0x658);
    *(undefined8 *)(lVar1 + 0x118) = 0xffffffffffffffff;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int update_1rtt_egress_key(quicly_conn_t *conn)
{
    struct st_quicly_application_space_t *space = conn->application;
    ptls_cipher_suite_t *cipher = ptls_get_cipher(conn->crypto.tls);
    int ret;

    /* generate next AEAD key, and increment key phase if it succeeds */
    if ((ret = update_1rtt_key(conn, cipher, 1, &space->cipher.egress.key.aead, space->cipher.egress.secret)) != 0)
        return ret;
    ++space->cipher.egress.key_phase;

    /* signal that we are waiting for an ACK */
    space->cipher.egress.key_update_pn.last = conn->egress.packet_number;
    space->cipher.egress.key_update_pn.next = UINT64_MAX;

    QUICLY_PROBE(CRYPTO_SEND_KEY_UPDATE, conn, conn->stash.now, space->cipher.egress.key_phase,
                 QUICLY_PROBE_HEXDUMP(space->cipher.egress.secret, cipher->hash->digest_size));

    return 0;
}